

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

int bssl::send_flight(SSL *ssl)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  BIO *b;
  uchar *data;
  pointer bio;
  size_t *in_R8;
  Span<unsigned_char> out;
  undefined1 auStack_58 [4];
  int bio_ret;
  uchar *local_50;
  int local_48;
  undefined4 uStack_44;
  size_t packet_len;
  uint32_t old_offset;
  uint8_t old_written;
  undefined1 local_28 [8];
  Array<unsigned_char> packet;
  SSL *ssl_local;
  
  packet.size_ = (size_t)ssl;
  if (ssl->s3->write_shutdown == ssl_shutdown_none) {
    bVar2 = std::operator==(&ssl->wbio,(nullptr_t)0x0);
    if (bVar2) {
      ERR_put_error(0x10,0,0x77,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x36e);
      ssl_local._4_4_ = -1;
    }
    else if (*(uint *)(*(long *)(packet.size_ + 0x38) + 0x3cc) < 0xd) {
      dtls1_update_mtu((SSL *)packet.size_);
      Array<unsigned_char>::Array((Array<unsigned_char> *)local_28);
      bVar2 = Array<unsigned_char>::InitForOverwrite
                        ((Array<unsigned_char> *)local_28,
                         (ulong)*(uint *)(*(long *)(packet.size_ + 0x38) + 0x3c8));
      if (bVar2) {
        do {
          do {
            bVar1 = *(byte *)(*(long *)(packet.size_ + 0x38) + 0x3c0);
            sVar4 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::size
                              ((InplaceVector<bssl::DTLSOutgoingMessage,_7UL> *)
                               (*(long *)(packet.size_ + 0x38) + 0x150));
            sVar5 = packet.size_;
            if (sVar4 <= bVar1) {
              bio = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                              ((unique_ptr<bio_st,_bssl::internal::Deleter> *)(packet.size_ + 0x20))
              ;
              iVar3 = BIO_flush(bio);
              if (iVar3 < 1) {
                *(undefined4 *)(*(long *)(packet.size_ + 0x30) + 0xc4) = 3;
                ssl_local._4_4_ = -1;
              }
              else {
                ssl_local._4_4_ = 1;
              }
              goto LAB_001dd545;
            }
            packet_len._7_1_ = *(undefined1 *)(*(long *)(packet.size_ + 0x38) + 0x3c0);
            packet_len._0_4_ = *(undefined4 *)(*(long *)(packet.size_ + 0x38) + 0x3c4);
            Span<unsigned_char>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                      ((Span<unsigned_char> *)auStack_58,(Array<unsigned_char> *)local_28);
            out.size_ = (size_t)&local_48;
            out.data_ = local_50;
            bVar2 = seal_next_packet((bssl *)sVar5,_auStack_58,out,in_R8);
            if (!bVar2) {
              ssl_local._4_4_ = -1;
              goto LAB_001dd545;
            }
            if ((CONCAT44(uStack_44,local_48) == 0) &&
               (bVar1 = *(byte *)(*(long *)(packet.size_ + 0x38) + 0x3c0),
               sVar5 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::size
                                 ((InplaceVector<bssl::DTLSOutgoingMessage,_7UL> *)
                                  (*(long *)(packet.size_ + 0x38) + 0x150)), bVar1 < sVar5)) {
              ERR_put_error(0x10,0,0xa9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                            ,0x38b);
              ssl_local._4_4_ = 0;
              goto LAB_001dd545;
            }
          } while (CONCAT44(uStack_44,local_48) == 0);
          b = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bio_st,_bssl::internal::Deleter> *)(packet.size_ + 0x20)
                               );
          data = Array<unsigned_char>::data((Array<unsigned_char> *)local_28);
          ssl_local._4_4_ = BIO_write(b,data,local_48);
        } while (0 < ssl_local._4_4_);
        *(undefined1 *)(*(long *)(packet.size_ + 0x38) + 0x3c0) = packet_len._7_1_;
        *(undefined4 *)(*(long *)(packet.size_ + 0x38) + 0x3c4) = (undefined4)packet_len;
        *(undefined4 *)(*(long *)(packet.size_ + 0x30) + 0xc4) = 3;
      }
      else {
        ssl_local._4_4_ = -1;
      }
LAB_001dd545:
      old_offset = 1;
      Array<unsigned_char>::~Array((Array<unsigned_char> *)local_28);
    }
    else {
      ERR_put_error(0x10,0,0xc6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x373);
      ssl_local._4_4_ = -1;
    }
  }
  else {
    ERR_put_error(0x10,0,0xc2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x369);
    ssl_local._4_4_ = -1;
  }
  return ssl_local._4_4_;
}

Assistant:

static int send_flight(SSL *ssl) {
  if (ssl->s3->write_shutdown != ssl_shutdown_none) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PROTOCOL_IS_SHUTDOWN);
    return -1;
  }

  if (ssl->wbio == nullptr) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BIO_NOT_SET);
    return -1;
  }

  if (ssl->d1->num_timeouts > DTLS1_MAX_TIMEOUTS) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_READ_TIMEOUT_EXPIRED);
    return -1;
  }

  dtls1_update_mtu(ssl);

  Array<uint8_t> packet;
  if (!packet.InitForOverwrite(ssl->d1->mtu)) {
    return -1;
  }

  while (ssl->d1->outgoing_written < ssl->d1->outgoing_messages.size()) {
    uint8_t old_written = ssl->d1->outgoing_written;
    uint32_t old_offset = ssl->d1->outgoing_offset;

    size_t packet_len;
    if (!seal_next_packet(ssl, Span(packet), &packet_len)) {
      return -1;
    }

    if (packet_len == 0 &&
        ssl->d1->outgoing_written < ssl->d1->outgoing_messages.size()) {
      // We made no progress with the packet size available, but did not reach
      // the end.
      OPENSSL_PUT_ERROR(SSL, SSL_R_MTU_TOO_SMALL);
      return false;
    }

    if (packet_len != 0) {
      int bio_ret = BIO_write(ssl->wbio.get(), packet.data(), packet_len);
      if (bio_ret <= 0) {
        // Retry this packet the next time around.
        ssl->d1->outgoing_written = old_written;
        ssl->d1->outgoing_offset = old_offset;
        ssl->s3->rwstate = SSL_ERROR_WANT_WRITE;
        return bio_ret;
      }
    }
  }

  if (BIO_flush(ssl->wbio.get()) <= 0) {
    ssl->s3->rwstate = SSL_ERROR_WANT_WRITE;
    return -1;
  }

  return 1;
}